

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O1

void tgt_encode(opj_bio_t *bio,opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 threshold)

{
  opj_tgt_node *poVar1;
  int iVar2;
  int iVar3;
  opj_tgt_node_t *poVar4;
  long *plVar5;
  opj_tgt_node_t *stk [31];
  long local_128 [31];
  
  plVar5 = local_128;
  poVar4 = tree->nodes + leafno;
  poVar1 = poVar4->parent;
  while (poVar1 != (opj_tgt_node *)0x0) {
    *plVar5 = (long)poVar4;
    plVar5 = plVar5 + 1;
    poVar4 = poVar4->parent;
    poVar1 = poVar4->parent;
  }
  iVar3 = 0;
  do {
    iVar2 = poVar4->low;
    if (poVar4->low < iVar3) {
      poVar4->low = iVar3;
      iVar2 = iVar3;
    }
    iVar3 = iVar2;
    if (iVar2 < threshold) {
      do {
        if (poVar4->value <= iVar2) {
          iVar3 = iVar2;
          if (poVar4->known == 0) {
            bio_write(bio,1,1);
            poVar4->known = 1;
          }
          break;
        }
        bio_write(bio,0,1);
        iVar2 = iVar2 + 1;
        iVar3 = threshold;
      } while (threshold != iVar2);
    }
    poVar4->low = iVar3;
    if (plVar5 == local_128) {
      return;
    }
    poVar4 = (opj_tgt_node_t *)plVar5[-1];
    plVar5 = plVar5 + -1;
  } while( true );
}

Assistant:

void tgt_encode(opj_bio_t *bio, opj_tgt_tree_t *tree, OPJ_UINT32 leafno, OPJ_INT32 threshold) {
	opj_tgt_node_t *stk[31];
	opj_tgt_node_t **stkptr;
	opj_tgt_node_t *node;
	OPJ_INT32 low;

	stkptr = stk;
	node = &tree->nodes[leafno];
	while (node->parent) {
		*stkptr++ = node;
		node = node->parent;
	}
	
	low = 0;
	for (;;) {
		if (low > node->low) {
			node->low = low;
		} else {
			low = node->low;
		}
		
		while (low < threshold) {
			if (low >= node->value) {
				if (!node->known) {
					bio_write(bio, 1, 1);
					node->known = 1;
				}
				break;
			}
			bio_write(bio, 0, 1);
			++low;
		}
		
		node->low = low;
		if (stkptr == stk)
			break;
		node = *--stkptr;
	}
}